

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

void Gia_Sim2InfoRefineEquivs(Gia_Sim2_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Gia_Man_t *pGVar3;
  ulong uVar4;
  int Entry;
  long lVar5;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  pGVar3 = p->pAig;
  if (pGVar3->nObjs < 2) {
LAB_0075f58d:
    Gia_Sim2ProcessRefined(p,p_00);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    pGVar3 = p->pAig;
    if (1 < pGVar3->nObjs) {
      lVar5 = 1;
      do {
        if (((~(uint)pGVar3->pReprs[lVar5] & 0xfffffff) == 0) && (0 < pGVar3->pNexts[lVar5])) {
          Gia_Sim2ClassRefineOne(p,(int)lVar5);
        }
        lVar5 = lVar5 + 1;
        pGVar3 = p->pAig;
      } while (lVar5 < pGVar3->nObjs);
    }
    return;
  }
  lVar5 = 1;
LAB_0075f502:
  if (((uint)pGVar3->pReprs[lVar5] & 0xfffffff) == 0) {
    uVar1 = p->nWords;
    Entry = (int)lVar5;
    if (*(long *)(pGVar3->pObjs + lVar5) < 0) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          if (p->pDataSim[(long)(int)(uVar1 * Entry) + uVar4] != 0xffffffff) goto LAB_0075f580;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if (p->pDataSim[(long)(int)(uVar1 * Entry) + uVar4] != 0) goto LAB_0075f580;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  goto LAB_0075f513;
LAB_0075f580:
  Vec_IntPush(p_00,Entry);
LAB_0075f513:
  lVar5 = lVar5 + 1;
  pGVar3 = p->pAig;
  if (pGVar3->nObjs <= lVar5) goto LAB_0075f58d;
  goto LAB_0075f502;
}

Assistant:

void Gia_Sim2InfoRefineEquivs( Gia_Sim2_t * p )
{
    Vec_Int_t * vRefined;
    Gia_Obj_t * pObj;
    unsigned * pSim;
    int i, Count = 0;
    // process constant candidates
    vRefined = Vec_IntAlloc( 100 );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( !Gia_ObjIsConst(p->pAig, i) )
            continue;
        pSim = Gia_Sim2Data( p, i );
//Extra_PrintBinary( stdout, pSim, 32 * p->nWords );  printf( "\n" );
        if ( !Gia_Sim2CompareZero( pSim, p->nWords, Gia_ObjPhase(pObj) ) )
        {
            Vec_IntPush( vRefined, i );
            Count++;
        }
    }
    Gia_Sim2ProcessRefined( p, vRefined );
    Vec_IntFree( vRefined );
    // process other classes
    Gia_ManForEachClass( p->pAig, i )
        Count += Gia_Sim2ClassRefineOne( p, i );
//    if ( Count )
//        printf( "Refined %d times.\n", Count );
}